

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lazy.h
# Opt level: O0

Try<void> __thiscall
async_simple::coro::detail::LazyAwaiterBase<async_simple::Try<void>_>::awaitResume
          (LazyAwaiterBase<async_simple::Try<void>_> *this)

{
  coroutine_handle<async_simple::coro::detail::LazyPromise<async_simple::Try<void>_>_> *in_RSI;
  exception_ptr in_RDI;
  Try<void> r;
  Try<void> *in_stack_ffffffffffffffb8;
  exception_ptr this_00;
  LazyPromise<async_simple::Try<void>_> *in_stack_ffffffffffffffe0;
  
  this_00._M_exception_object = in_RDI._M_exception_object;
  std::coroutine_handle<async_simple::coro::detail::LazyPromise<async_simple::Try<void>_>_>::promise
            (in_RSI);
  LazyPromise<async_simple::Try<void>_>::result(in_stack_ffffffffffffffe0);
  Try<void>::Try((Try<void> *)this_00._M_exception_object,in_stack_ffffffffffffffb8);
  std::coroutine_handle<async_simple::coro::detail::LazyPromise<async_simple::Try<void>_>_>::destroy
            ((coroutine_handle<async_simple::coro::detail::LazyPromise<async_simple::Try<void>_>_> *
             )0x3349e9);
  std::coroutine_handle<async_simple::coro::detail::LazyPromise<async_simple::Try<void>_>_>::
  operator=(in_RSI,(nullptr_t)0x0);
  Try<void>::Try((Try<void> *)this_00._M_exception_object,in_stack_ffffffffffffffb8);
  Try<void>::~Try((Try<void> *)0x334a14);
  return (Try<void>)(exception_ptr)in_RDI._M_exception_object;
}

Assistant:

auto awaitResume() {
        if constexpr (std::is_void_v<T>) {
            _handle.promise().result();
            // We need to destroy the handle expclictly since the awaited
            // coroutine after symmetric transfer couldn't release it self any
            // more.
            _handle.destroy();
            _handle = nullptr;
        } else {
            auto r = std::move(_handle.promise()).result();
            _handle.destroy();
            _handle = nullptr;
            return r;
        }
    }